

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O0

void TPZShapeHDivConstant<pzshape::TPZShapeQuad>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  int64_t iVar1;
  int *piVar2;
  long in_RCX;
  TPZVec<int> *in_RSI;
  int ic;
  int ic_1;
  int i;
  int conSize;
  TPZShapeData *in_stack_00000060;
  TPZVec<int> *in_stack_00000068;
  TPZVec<long> *in_stack_00000070;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff58;
  int iVar3;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar4;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int64_t in_stack_ffffffffffffff68;
  TPZManVector<int,_27> *in_stack_ffffffffffffff70;
  TPZVec<int> *in_stack_ffffffffffffff78;
  TPZManVector<int,_20> *in_stack_ffffffffffffff80;
  
  TPZManVector<int,_20>::TPZManVector(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  TPZManVector<int,_20>::operator=
            ((TPZManVector<int,_20> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (TPZManVector<int,_20> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
  TPZManVector<int,_20>::~TPZManVector
            ((TPZManVector<int,_20> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
  ;
  TPZManVector<int,_27>::Resize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  TPZManVector<int,_27>::Resize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  iVar1 = TPZVec<int>::size(in_RSI);
  iVar3 = (int)iVar1;
  for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + 1) {
    piVar2 = TPZVec<int>::operator[](in_RSI,(long)iVar4);
    *piVar2 = *piVar2 + 1;
  }
  TPZShapeH1<pzshape::TPZShapeQuad>::Initialize
            (in_stack_00000070,in_stack_00000068,in_stack_00000060);
  for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
    piVar2 = TPZVec<int>::operator[](in_RSI,(long)iVar3);
    iVar4 = *piVar2;
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RCX + 0x2b50),(long)iVar3);
    *piVar2 = iVar4;
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RCX + 0x100),(long)iVar3);
    iVar4 = *piVar2 + 1;
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RCX + 0x2be0),(long)iVar3);
    *piVar2 = iVar4;
  }
  piVar2 = TPZVec<int>::operator[](in_RSI,4);
  iVar3 = *piVar2;
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RCX + 0x2b50),4);
  *piVar2 = iVar3;
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RCX + 0x100),4);
  iVar3 = *piVar2;
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RCX + 0x2be0),4);
  *piVar2 = iVar3;
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Initialize(TPZVec<int64_t> &ids,
                TPZVec<int> &connectorders,
                const TPZVec<int>& sideorient, 
                TPZShapeData &data)
{
    data.fSideOrient = sideorient;
    data.fHDivConnectOrders.Resize(TSHAPE::NFacets+1);
    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    if(TSHAPE::Dimension == 2)
    {
        //Compatibilize the polynomial order
        int conSize = connectorders.size();
        for (int i = 0; i < conSize; i++){
            connectorders[i]++;
        }
        if (TSHAPE::Type() == ETriangle){
            connectorders[conSize-1]++;
        }
        //Initialize data structures
        TPZShapeH1<TSHAPE>::Initialize(ids,connectorders,data);

        for(int ic = 0; ic<TSHAPE::NFacets;ic++)
        {
            data.fHDivConnectOrders[ic] =  connectorders[ic];
            data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic]+1;
        }
        int ic = TSHAPE::NFacets;
        data.fHDivConnectOrders[ic] =  connectorders[ic];
        data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic];
    }
    else
    {
        //Compatibilize the polynomial order
        if (TSHAPE::Type() == ETetraedro) {
            int conSize = connectorders.size();
            for (int i = 0; i < conSize; i++){
                connectorders[i]++;
            }
            connectorders[conSize-1]++;
        }

        const int nedges = TSHAPE::NSides-TSHAPE::NFacets-TSHAPE::NCornerNodes-1;
        TPZManVector<int,15> locconorders(TSHAPE::NSides-TSHAPE::NCornerNodes,1);
        for(int ic = nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes; ic++)
        {
            locconorders[ic] = connectorders[ic-nedges];
        }
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids, locconorders, data);
//        TPZManVector<int> HCurlNumConnectShapeF = data.fHDivNumConnectShape;
//        data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
//        for(int ic=nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes-1; ic++)
//        {
//            int numshape = HCurlNumConnectShapeF[ic]+1;
//            data.fHDivNumConnectShape[ic-nedges] = numshape;
//        }
//        int ic = TSHAPE::NSides-TSHAPE::NCornerNodes-1;
//        int numshape = HCurlNumConnectShapeF[ic];
//        data.fHDivNumConnectShape[ic-nedges] = numshape;
    }
}